

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

bool __thiscall
upb::generator::anon_unknown_2::CGenerator::Generate
          (CGenerator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  int iVar1;
  initializer_list<const_google::protobuf::FileDescriptor_*> __l;
  allocator_type local_49;
  FileDescriptor *local_48;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  files;
  
  __l._M_len = 1;
  __l._M_array = &local_48;
  local_48 = file;
  std::
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::vector(&files,__l,&local_49);
  iVar1 = (*(this->super_CodeGenerator)._vptr_CodeGenerator[3])
                    (this,&files,parameter,generator_context,error);
  std::
  _Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Vector_base(&files.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 );
  return SUB41(iVar1,0);
}

Assistant:

bool Generate(const google::protobuf::FileDescriptor* file,
                const std::string& parameter,
                google::protobuf::compiler::GeneratorContext* generator_context,
                std::string* error) const override {
    std::vector<const google::protobuf::FileDescriptor*> files{file};
    return GenerateAll(files, parameter, generator_context, error);
  }